

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O1

void pzshape::TPZShapeCube::Shape3dCubeInternal
               (TPZVec<Fad<double>_> *x,int order,TPZVec<Fad<double>_> *phi)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  TPZVec<Fad<double>_> phi2;
  TPZVec<Fad<double>_> phi1;
  TPZVec<Fad<double>_> phi0;
  TPZVec<Fad<double>_> local_e0;
  TPZVec<Fad<double>_> local_c0;
  TPZVec<Fad<double>_> local_a0;
  long local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_60;
  undefined1 local_50 [32];
  
  if (0 < order) {
    local_c0._vptr_TPZVec = (_func_int **)0x0;
    Fad<double>::Fad((Fad<double> *)&local_a0,3,(double *)&local_c0);
    (*phi->_vptr_TPZVec[2])(phi,(ulong)(uint)(order * order * order),&local_a0);
    Fad<double>::~Fad((Fad<double> *)&local_a0);
    local_e0._vptr_TPZVec = (_func_int **)0x0;
    Fad<double>::Fad((Fad<double> *)&local_c0,3,(double *)&local_e0);
    TPZVec<Fad<double>_>::TPZVec(&local_a0,0x14,(Fad<double> *)&local_c0);
    Fad<double>::~Fad((Fad<double> *)&local_c0);
    local_50._0_8_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)0x0;
    Fad<double>::Fad((Fad<double> *)&local_e0,3,(double *)local_50);
    TPZVec<Fad<double>_>::TPZVec(&local_c0,0x14,(Fad<double> *)&local_e0);
    Fad<double>::~Fad((Fad<double> *)&local_e0);
    local_60.fadexpr_.left_ = (Fad<double> *)0x0;
    Fad<double>::Fad((Fad<double> *)local_50,3,(double *)&local_60);
    TPZVec<Fad<double>_>::TPZVec(&local_e0,0x14,(Fad<double> *)local_50);
    Fad<double>::~Fad((Fad<double> *)local_50);
    (*(code *)TPZShapeLinear::FADfOrthogonal)(x->fStore,order,&local_a0);
    (*(code *)TPZShapeLinear::FADfOrthogonal)(x->fStore + 1,order,&local_c0);
    (*(code *)TPZShapeLinear::FADfOrthogonal)(x->fStore + 2,order,&local_e0);
    uVar3 = (ulong)(uint)order;
    local_80 = uVar3 * uVar3 * 0x20;
    lVar4 = 0;
    uVar5 = 0;
    do {
      uVar6 = 0;
      local_78 = uVar5;
      local_70 = lVar4;
      do {
        lVar2 = 0;
        local_68 = uVar6;
        do {
          local_60.fadexpr_.left_ = local_a0.fStore + uVar5;
          local_60.fadexpr_.right_ = local_c0.fStore + uVar6;
          local_50._8_8_ = (long)&(local_e0.fStore)->val_ + lVar2;
          local_50._0_8_ = &local_60;
          Fad<double>::operator=
                    ((Fad<double> *)((long)&phi->fStore->val_ + lVar2 + lVar4),
                     (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                      *)local_50);
          lVar2 = lVar2 + 0x20;
        } while (uVar3 * 0x20 != lVar2);
        uVar6 = local_68 + 1;
        lVar4 = lVar4 + uVar3 * 0x20;
      } while (uVar6 != uVar3);
      uVar5 = local_78 + 1;
      lVar4 = local_70 + local_80;
    } while (uVar5 != uVar3);
    local_e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846938;
    if (local_e0.fStore != (Fad<double> *)0x0) {
      dVar1 = local_e0.fStore[-1].defaultVal;
      if (dVar1 != 0.0) {
        lVar4 = (long)dVar1 << 5;
        do {
          Fad<double>::~Fad((Fad<double> *)((long)&local_e0.fStore[-1].val_ + lVar4));
          lVar4 = lVar4 + -0x20;
        } while (lVar4 != 0);
      }
      operator_delete__(&local_e0.fStore[-1].defaultVal,(long)dVar1 << 5 | 8);
    }
    local_c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846938;
    if (local_c0.fStore != (Fad<double> *)0x0) {
      dVar1 = local_c0.fStore[-1].defaultVal;
      if (dVar1 != 0.0) {
        lVar4 = (long)dVar1 << 5;
        do {
          Fad<double>::~Fad((Fad<double> *)((long)&local_c0.fStore[-1].val_ + lVar4));
          lVar4 = lVar4 + -0x20;
        } while (lVar4 != 0);
      }
      operator_delete__(&local_c0.fStore[-1].defaultVal,(long)dVar1 << 5 | 8);
    }
    local_a0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846938;
    if (local_a0.fStore != (Fad<double> *)0x0) {
      dVar1 = local_a0.fStore[-1].defaultVal;
      if (dVar1 != 0.0) {
        lVar4 = (long)dVar1 << 5;
        do {
          Fad<double>::~Fad((Fad<double> *)((long)&local_a0.fStore[-1].val_ + lVar4));
          lVar4 = lVar4 + -0x20;
        } while (lVar4 != 0);
      }
      operator_delete__(&local_a0.fStore[-1].defaultVal,(long)dVar1 << 5 | 8);
    }
  }
  return;
}

Assistant:

void TPZShapeCube::Shape3dCubeInternal(TPZVec<FADREAL> &x, int order,TPZVec<FADREAL> &phi)
	{
		const int ndim = 3;
		
		if(order < 1) return;
		int ord = order;//fSideOrder[18]-1;
		order = order*order*order;
		phi.Resize(order, FADREAL(ndim, 0.0));
		TPZVec<FADREAL> phi0(20, FADREAL(ndim, 0.0)),
		phi1(20, FADREAL(ndim, 0.0)),
		phi2(20, FADREAL(ndim, 0.0));
		TPZShapeLinear::FADfOrthogonal(x[0],ord,phi0);
		TPZShapeLinear::FADfOrthogonal(x[1],ord,phi1);
		TPZShapeLinear::FADfOrthogonal(x[2],ord,phi2);
		for (int i=0;i<ord;i++) {
			for (int j=0;j<ord;j++) {
				for (int k=0;k<ord;k++) {
					int index = ord*(ord*i+j)+k;
					//phi(index,0) =  phi0(i,0)* phi1(j,0)* phi2(k,0);
					phi[index] =  phi0[i] * phi1[j] * phi2[k];
					/*dphi(0,index) = dphi0(0,i)* phi1(j,0)* phi2(k,0);
					 dphi(1,index) =  phi0(i,0)*dphi1(0,j)* phi2(k,0);
					 dphi(2,index) =  phi0(i,0)* phi1(j,0)*dphi2(0,k);
					 */
				}
			}
		}
	}